

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtract.hpp
# Opt level: O1

uint duckdb::SubtractOperatorOverflowCheck::Operation<unsigned_int,unsigned_int,unsigned_int>
               (uint left,uint right)

{
  OutOfRangeException *this;
  PhysicalType type;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  if ((right <= left) && ((ulong)left - (ulong)right >> 0x20 == 0)) {
    return (uint)((ulong)left - (ulong)right);
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,"Overflow in subtraction of %s (%s - %s)!","");
  TypeIdToString_abi_cxx11_(&local_40,(duckdb *)0x6,type);
  NumericHelper::ToString<unsigned_int>(&local_60,left);
  NumericHelper::ToString<unsigned_int>(&local_80,right);
  OutOfRangeException::
  OutOfRangeException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (this,&local_a0,&local_40,&local_60,&local_80);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA left, TB right) {
		TR result;
		if (!TrySubtractOperator::Operation(left, right, result)) {
			throw OutOfRangeException("Overflow in subtraction of %s (%s - %s)!", TypeIdToString(GetTypeId<TA>()),
			                          NumericHelper::ToString(left), NumericHelper::ToString(right));
		}
		return result;
	}